

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::substitute(Forth *this)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  iterator iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_type sVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ForthStack<unsigned_int> *pFVar15;
  string Word2;
  string Word1;
  string keyUpper;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint local_e4;
  ulong local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  uint local_94;
  ForthStack<unsigned_int> *local_90;
  Forth *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Base_ptr local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  requireDStackDepth(this,4,"SUBSTITUTE");
  pFVar15 = &this->dStack;
  local_94 = ForthStack<unsigned_int>::getTop(pFVar15);
  ForthStack<unsigned_int>::pop(pFVar15);
  local_e4 = ForthStack<unsigned_int>::getTop(pFVar15);
  uVar4 = ForthStack<unsigned_int>::getTop(pFVar15,1);
  local_90 = pFVar15;
  uVar5 = ForthStack<unsigned_int>::getTop(pFVar15,2);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_88 = this;
  moveFromDataSpace(this,&local_b8,uVar5,(ulong)uVar4);
  sVar3 = local_b8._M_string_length;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_e0 = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if (local_b8._M_string_length != 0) {
    local_38 = &local_88->replacesSubstitute;
    local_40 = &(local_88->replacesSubstitute)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar14 = 0;
    local_e0 = 0;
    do {
      _Var2._M_p = local_b8._M_dataplus._M_p;
      if (((local_b8._M_string_length < uVar14 || local_b8._M_string_length - uVar14 == 0) ||
          (pvVar6 = memchr(local_b8._M_dataplus._M_p + uVar14,0x25,
                           local_b8._M_string_length - uVar14), pvVar6 == (void *)0x0)) ||
         (lVar10 = (long)pvVar6 - (long)_Var2._M_p, lVar10 == -1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_108,&local_b8,uVar14,sVar3 - uVar14);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_d8,local_108._M_dataplus._M_p,local_108._M_string_length);
LAB_0010f443:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_108,&local_b8,uVar14,lVar10 - uVar14);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d8,local_108._M_dataplus._M_p,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      _Var2._M_p = local_b8._M_dataplus._M_p;
      uVar14 = (ulong)((int)lVar10 + 1);
      if (sVar3 < uVar14 || sVar3 - uVar14 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"%");
        break;
      }
      if (((local_b8._M_string_length < uVar14 || local_b8._M_string_length - uVar14 == 0) ||
          (pvVar6 = memchr(local_b8._M_dataplus._M_p + uVar14,0x25,
                           local_b8._M_string_length - uVar14), pvVar6 == (void *)0x0)) ||
         (lVar13 = (long)pvVar6 - (long)_Var2._M_p, lVar13 == -1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"%");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_108,&local_b8,uVar14,sVar3 - uVar14);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_d8,local_108._M_dataplus._M_p,local_108._M_string_length);
        goto LAB_0010f443;
      }
      if (lVar13 - uVar14 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"%");
        iVar12 = (int)lVar10 + 2;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_108,&local_b8,uVar14,lVar13 - uVar14);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_60,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_80,&local_60);
        if (local_80._M_string_length != 0) {
          sVar9 = 0;
          do {
            cVar1 = local_80._M_dataplus._M_p[sVar9];
            cVar11 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar11 = cVar1;
            }
            local_80._M_dataplus._M_p[sVar9] = cVar11;
            sVar9 = sVar9 + 1;
          } while (local_80._M_string_length != sVar9);
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_38->_M_t,&local_80);
        if (iVar7._M_node == local_40) {
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_d8,"%");
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(pbVar8,local_60._M_dataplus._M_p,local_60._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (pbVar8,"%");
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_d8,*(char **)(iVar7._M_node + 2),(size_type)iVar7._M_node[2]._M_parent);
          local_e0 = (ulong)((int)local_e0 + 1);
        }
        iVar12 = (int)lVar13 + 1;
      }
      uVar14 = (ulong)iVar12;
    } while (uVar14 < sVar3);
  }
  sVar3 = local_d8._M_string_length;
  _Var2._M_p = local_d8._M_dataplus._M_p;
  uVar4 = local_e4;
  uVar5 = 0xffffffff;
  pFVar15 = local_90;
  if (local_d8._M_string_length <= local_94) {
    if (local_d8._M_string_length == 0) {
      uVar4 = 0;
    }
    else {
      uVar14 = 0;
      do {
        dataSpaceSet(local_88,uVar4 + (int)uVar14,_Var2._M_p[uVar14]);
        uVar14 = uVar14 + 1;
      } while (sVar3 != uVar14);
      uVar4 = (uint)local_d8._M_string_length;
    }
    pFVar15 = local_90;
    ForthStack<unsigned_int>::setTop(local_90,1,uVar4);
    ForthStack<unsigned_int>::setTop(pFVar15,2,local_e4);
    uVar5 = (uint)local_e0;
  }
  uVar4 = 0xffffffff;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  ForthStack<unsigned_int>::setTop(pFVar15,uVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void substitute(){
			REQUIRE_DSTACK_DEPTH(4, "SUBSTITUTE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); ;
			auto length1 = dStack.getTop(1); ;
			auto caddr1 = CADDR(dStack.getTop(2));; 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{}, key{}, keyUpper{};
			auto result = 0;
			auto processedIt=0;
			auto processEnd=Word1.size();
			// start processing of Word1
			while(processedIt<processEnd){
				//auto nextPercent=std::find(processedIt,processEnd,'%');
				auto nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// copy chars to buffer and exit from loop
					Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					break;	
				}
				// copy chars before percent char
				Word2.append(Word1.substr(processedIt,nextPercent-processedIt));
				processedIt=nextPercent+1;
				if(processedIt>=processEnd) {
					Word2.append("%");
					break;
				} 
				nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// unclosed percent chars - everything copied to the buffer
					 Word2.append("%");
					 Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					 break;
				}
				if(nextPercent==processedIt){
					// two percents replaced by one percent
					Word2.append("%");
					++processedIt;
					continue;
				}
				key=Word1.substr(processedIt,nextPercent-processedIt);
				keyUpper=key;
				for(auto &c : keyUpper) c=toupper_ascii(c);
				auto foundIt=replacesSubstitute.find(keyUpper);
				if(foundIt==replacesSubstitute.end()){
					Word2.append("%").append(key).append("%");
				} else {
				 Word2.append((*foundIt).second);
				 ++result;
				}
				processedIt=nextPercent+1;
			}
			if(Word2.size()> length2) {
				result=-1;
			} else {
				moveIntoDataSpace( caddr2, Word2.c_str(), CELL(Word2.size()));
				dStack.setTop(1, CELL(Word2.size()) );
				dStack.setTop(2, CELL(caddr2) );

			}
			dStack.setTop((result < 0) ? -1 : result ); 
		}